

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O2

boolean create_room(level *lev,xchar x,xchar y,xchar w,xchar h,xchar xal,xchar yal,xchar rtype,
                   xchar rlit)

{
  char cVar1;
  char cVar2;
  int iVar3;
  xchar xVar4;
  byte bVar5;
  boolean bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  nhrect *r1;
  int iVar12;
  char cVar13;
  int iVar14;
  char cVar15;
  char cVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  bool vault;
  bool bVar24;
  xchar yabs;
  xchar xabs;
  xchar dy;
  xchar dx;
  nhrect r2;
  
  if (rtype == -1) {
    rtype = '\0';
  }
  vault = rtype == '\x04';
  iVar17 = vault + 4;
  iVar18 = vault + 3;
  if (rlit == -1) {
    bVar5 = depth(&lev->z);
    uVar7 = rnd((uint)(byte)(((bVar5 ^ (char)bVar5 >> 7) - ((char)bVar5 >> 7)) + 1));
    if (uVar7 < 0xb) {
      uVar7 = mt_random();
      rlit = uVar7 % 0x4d != 0;
    }
    else {
      rlit = '\0';
    }
  }
  uVar7 = 0;
  iVar8 = vault + 5;
  iVar9 = vault + 4;
  do {
    iVar21 = (int)h;
    iVar14 = (int)w;
    if ((char)(w & xal & y & x & yal) < '\0' || rtype == '\x04') {
      r1 = rnd_rect();
      if (r1 == (nhrect *)0x0) goto LAB_0023a0f2;
      cVar16 = r1->hx;
      iVar22 = (int)cVar16;
      cVar1 = r1->hy;
      cVar13 = r1->lx;
      iVar23 = (int)cVar13;
      cVar2 = r1->ly;
      if (rtype == '\x04') {
        dy = '\x01';
        dx = '\x01';
        iVar20 = iVar22 - iVar23;
        cVar15 = '\x01';
      }
      else {
        iVar20 = iVar22 - iVar23;
        iVar10 = rn2((uint)(0x1c < iVar20) * 4 + 8);
        cVar15 = (char)iVar10 + '\x02';
        dx = cVar15;
        uVar11 = mt_random();
        dy = ((byte)uVar11 & 3) + 2;
        if (0x32 < (int)((uint)(byte)dy * (int)cVar15)) {
          dy = (xchar)(0x32 / (short)cVar15);
        }
      }
      xVar4 = dy;
      iVar10 = iVar8;
      if (cVar16 < 'O') {
        iVar10 = iVar17 * 2;
      }
      if (cVar13 < '\x01') {
        iVar10 = iVar8;
      }
      if (iVar10 + cVar15 + 3 <= iVar20) {
        iVar20 = iVar9;
        if (cVar1 < '\x14') {
          iVar20 = iVar18 * 2;
        }
        if (cVar2 < '\x01') {
          iVar20 = iVar9;
        }
        iVar19 = (int)dy;
        if (iVar20 + iVar19 + 3 <= (int)cVar1 - (int)cVar2) {
          iVar12 = 3;
          iVar3 = 3;
          if ('\0' < cVar13) {
            iVar12 = iVar23;
            iVar3 = iVar17;
          }
          iVar22 = rn2((iVar22 - (iVar12 + iVar10 + (int)cVar15)) + 1);
          xabs = (char)iVar22 + (char)iVar3 + cVar13;
          iVar23 = 2;
          iVar22 = 2;
          if ('\0' < cVar2) {
            iVar23 = (int)cVar2;
            iVar22 = iVar18;
          }
          iVar23 = rn2(((int)cVar1 - (iVar23 + iVar19 + iVar20)) + 1);
          cVar16 = (char)iVar23 + (char)iVar22 + cVar2;
          yabs = cVar16;
          if (('\x13' < cVar1 && cVar2 == '\0') &&
             (((lev->nroom == 0 || (iVar22 = rn2(lev->nroom), iVar22 == 0)) &&
              (10 < cVar16 + iVar19)))) {
            uVar11 = mt_random();
            yabs = (char)((ulong)uVar11 % 3) + '\x02';
            if (('\x01' < xVar4) && (lev->nroom < 4)) {
              dy = xVar4 + -1;
            }
          }
          bVar6 = check_room(lev,&xabs,&dx,&yabs,&dy,vault);
          if (bVar6 != '\0') {
            r2.lx = xabs + -1;
            r2.ly = yabs + -1;
            r2.hx = xabs + (char)(dx + 1);
            r2.hy = (char)(dy + 1) + yabs;
            iVar21 = dy + 1;
            iVar14 = dx + 1;
            goto LAB_0023a090;
          }
        }
      }
      r1 = (nhrect *)0x0;
    }
    else {
      bVar24 = (char)(y & x) < '\0';
      iVar22 = (int)x;
      iVar23 = (int)y;
      if (bVar24) {
        iVar22 = rnd(5);
        iVar23 = rnd(5);
      }
      if ((char)(h | w) < '\0') {
        uVar11 = mt_random();
        iVar14 = uVar11 % 0xf + 3;
        uVar11 = mt_random();
        iVar21 = (uVar11 & 7) + 2;
      }
      iVar10 = (int)xal;
      if (xal == -1) {
        iVar10 = rnd(3);
      }
      iVar20 = (int)yal;
      if (yal == -1) {
        iVar20 = rnd(3);
      }
      cVar16 = (char)((long)(iVar22 * 0x50 + -0x50) / 5);
      xabs = cVar16 + '\x01';
      cVar1 = (char)((long)(iVar23 * 0x15 + -0x15) / 5);
      yabs = cVar1 + '\x01';
      cVar13 = (char)iVar14;
      if (iVar10 == 3) {
        xabs = xabs + (char)((int)((uint)(ushort)((short)(0x10U - iVar14) >> 0xf) << 0x10 |
                                  0x10U - iVar14 & 0xffff) / 2);
      }
      else if (iVar10 == 5) {
        xabs = (cVar16 - cVar13) + '\x11';
      }
      cVar16 = (char)iVar21;
      if (iVar20 == 3) {
        yabs = yabs + (char)((int)((uint)(ushort)((short)(4U - iVar21) >> 0xf) << 0x10 |
                                  4U - iVar21 & 0xffff) / 2);
      }
      else if (iVar20 == 5) {
        yabs = (cVar1 - cVar16) + '\x05';
      }
      if (0x4f < xabs + iVar14) {
        xabs = 'M' - cVar13;
      }
      if (xabs < '\x02') {
        xabs = '\x02';
      }
      if (0x14 < yabs + iVar21) {
        yabs = '\x12' - cVar16;
      }
      if (yabs < '\x02') {
        yabs = '\x02';
      }
      r2.lx = xabs + -1;
      r2.ly = yabs + -1;
      r2.hx = cVar13 + bVar24 + xabs;
      r2.hy = bVar24 + cVar16 + yabs;
      r1 = get_rect(&r2);
    }
LAB_0023a090:
  } while ((uVar7 < 100) && (uVar7 = uVar7 + 1, r1 == (nhrect *)0x0));
  if (r1 == (nhrect *)0x0) {
LAB_0023a0f2:
    bVar6 = '\0';
  }
  else {
    split_rects(r1,&r2);
    if (rtype == '\x04') {
      iVar17 = lev->nroom;
      lev->rooms[iVar17].lx = xabs;
      lev->rooms[iVar17].ly = yabs;
    }
    else {
      smeq[lev->nroom] = lev->nroom;
      add_room(lev,(int)xabs,(int)yabs,iVar14 + -1 + (int)xabs,iVar21 + -1 + (int)yabs,rlit,rtype,
               '\0');
    }
    bVar6 = '\x01';
  }
  return bVar6;
}

Assistant:

boolean create_room(struct level *lev, xchar x, xchar y, xchar w, xchar h,
		    xchar xal, xchar yal, xchar rtype, xchar rlit)
{
	xchar xabs, yabs;
	int wtmp, htmp, xaltmp, yaltmp, xtmp, ytmp;
	struct nhrect *r1 = NULL, r2;
	int trycnt = 0;
	boolean vault = FALSE;
	int xlim = XLIM, ylim = YLIM;

	if (rtype == -1)	/* Is the type random ? */
	    rtype = OROOM;

	if (rtype == VAULT) {
		vault = TRUE;
		xlim++;
		ylim++;
	}

	/* on low levels the room is lit (usually) */
	/* some other rooms may require lighting */

	/* is light state random ? */
	if (rlit == -1)
	    rlit = (rnd(1+abs(depth(&lev->z))) < 11 && rn2(77)) ? TRUE : FALSE;

	/*
	 * Here we will try to create a room. If some parameters are
	 * random we are willing to make several try before we give
	 * it up.
	 */
	do {
		xchar xborder, yborder;
		wtmp = w; htmp = h;
		xtmp = x; ytmp = y;
		xaltmp = xal; yaltmp = yal;

		/* First case : a totaly random room */

		if ((xtmp < 0 && ytmp <0 && wtmp < 0 && xaltmp < 0 &&
		   yaltmp < 0) || vault) {
			xchar hx, hy, lx, ly, dx, dy;
			r1 = rnd_rect(); /* Get a random rectangle */

			if (!r1) /* No more free rectangles ! */
				return FALSE;

			hx = r1->hx;
			hy = r1->hy;
			lx = r1->lx;
			ly = r1->ly;
			if (vault)
			    dx = dy = 1;
			else {
				dx = 2 + rn2((hx-lx > 28) ? 12 : 8);
				dy = 2 + rn2(4);
				if (dx*dy > 50)
				    dy = 50/dx;
			}
			xborder = (lx > 0 && hx < COLNO -1) ? 2*xlim : xlim+1;
			yborder = (ly > 0 && hy < ROWNO -1) ? 2*ylim : ylim+1;
			if (hx-lx < dx + 3 + xborder ||
			   hy-ly < dy + 3 + yborder) {
				r1 = 0;
				continue;
			}
			xabs = lx + (lx > 0 ? xlim : 3)
			    + rn2(hx - (lx>0?lx : 3) - dx - xborder + 1);
			yabs = ly + (ly > 0 ? ylim : 2)
			    + rn2(hy - (ly>0?ly : 2) - dy - yborder + 1);
			if (ly == 0 && hy >= (ROWNO-1) &&
			    (!lev->nroom || !rn2(lev->nroom)) && (yabs+dy > ROWNO/2)) {
			    yabs = rn1(3, 2);
			    if (lev->nroom < 4 && dy>1) dy--;
		        }
			if (!check_room(lev, &xabs, &dx, &yabs, &dy, vault)) {
				r1 = 0;
				continue;
			}
			wtmp = dx+1;
			htmp = dy+1;
			r2.lx = xabs-1; r2.ly = yabs-1;
			r2.hx = xabs + wtmp;
			r2.hy = yabs + htmp;
		} else {	/* Only some parameters are random */
			int rndpos = 0;
			if (xtmp < 0 && ytmp < 0) { /* Position is RANDOM */
				xtmp = rnd(5);
				ytmp = rnd(5);
				rndpos = 1;
			}
			if (wtmp < 0 || htmp < 0) { /* Size is RANDOM */
				wtmp = rn1(15, 3);
				htmp = rn1(8, 2);
			}
			if (xaltmp == -1) /* Horizontal alignment is RANDOM */
			    xaltmp = rnd(3);
			if (yaltmp == -1) /* Vertical alignment is RANDOM */
			    yaltmp = rnd(3);

			/* Try to generate real (absolute) coordinates here! */

			xabs = (((xtmp-1) * COLNO) / 5) + 1;
			yabs = (((ytmp-1) * ROWNO) / 5) + 1;
			switch (xaltmp) {
			      case LEFT:
				break;
			      case RIGHT:
				xabs += (COLNO / 5) - wtmp;
				break;
			      case CENTER:
				xabs += ((COLNO / 5) - wtmp) / 2;
				break;
			}
			switch (yaltmp) {
			      case TOP:
				break;
			      case BOTTOM:
				yabs += (ROWNO / 5) - htmp;
				break;
			      case CENTER:
				yabs += ((ROWNO / 5) - htmp) / 2;
				break;
			}

			if (xabs + wtmp - 1 > COLNO - 2)
			    xabs = COLNO - wtmp - 3;
			if (xabs < 2)
			    xabs = 2;
			if (yabs + htmp - 1> ROWNO - 2)
			    yabs = ROWNO - htmp - 3;
			if (yabs < 2)
			    yabs = 2;

			/* Try to find a rectangle that fit our room ! */

			r2.lx = xabs-1; r2.ly = yabs-1;
			r2.hx = xabs + wtmp + rndpos;
			r2.hy = yabs + htmp + rndpos;
			r1 = get_rect(&r2);
		}
	} while (++trycnt <= 100 && !r1);
	if (!r1) {	/* creation of room failed ? */
		return FALSE;
	}
	split_rects(r1, &r2);

	if (!vault) {
		smeq[lev->nroom] = lev->nroom;
		add_room(lev, xabs, yabs, xabs+wtmp-1, yabs+htmp-1,
			 rlit, rtype, FALSE);
	} else {
		lev->rooms[lev->nroom].lx = xabs;
		lev->rooms[lev->nroom].ly = yabs;
	}
	return TRUE;
}